

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_union(lyd_node_leaf_list *leaf,lys_type *type,int store,int ignore_fail,
                 lys_type **resolved_type)

{
  ly_ctx *ctx;
  lys_node *value;
  lys_type *type_00;
  lys_type *plVar1;
  int iVar2;
  int iVar3;
  lys_node *plVar4;
  char *pcVar5;
  bool bVar6;
  lyd_node *local_50;
  lyd_node *ret;
  int local_3c;
  int_log_opts local_38;
  int found;
  int_log_opts prev_ilo;
  
  found = store;
  if (type->base != LY_TYPE_UNION) {
    __assert_fail("type->base == LY_TYPE_UNION",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x1f49,
                  "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                 );
  }
  ctx = leaf->schema->module->ctx;
  if ((leaf->value_type == LY_TYPE_UNION) ||
     ((leaf->value_type == LY_TYPE_INST && ((leaf->value_flags & 1) != 0)))) {
    value = (lys_node *)lydict_insert(ctx,(leaf->value).binary,0);
  }
  else {
    value = (lys_node *)0x0;
  }
  if (found != 0) {
    lyd_free_value(leaf->value,leaf->value_type,leaf->value_flags,(lys_type *)&leaf->schema[1].ref,
                   leaf->value_str,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
    (leaf->value).binary = (char *)0x0;
  }
  ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,&local_38,(ly_err_item **)0x0);
  local_3c = 0;
  type_00 = lyp_get_next_union_type(type,(lys_type *)0x0,&local_3c);
  if (type_00 != (lys_type *)0x0) {
    ret = (lyd_node *)&leaf->value_str;
    do {
      local_3c = 0;
      if (type_00->base != LY_TYPE_INST) {
        if (type_00->base == LY_TYPE_LEAFREF) {
          iVar2 = -1;
          if ((ignore_fail != 1) && ((ignore_fail != 2 || ((leaf->schema->flags & 0x800) == 0)))) {
            iVar2 = (int)(type_00->info).lref.req;
          }
          iVar2 = resolve_leafref(leaf,(type_00->info).lref.path,iVar2,&local_50);
          bVar6 = iVar2 != 0;
          if ((found == 0) || (iVar2 != 0)) goto LAB_0011ac68;
          if ((local_50 == (lyd_node *)0x0) || ((leaf->schema->flags & 0x800) != 0)) {
            ly_ilo_restore((ly_ctx *)0x0,local_38,(ly_err_item *)0x0,0);
            plVar1 = lyp_parse_value(type_00,(char **)ret,(lyxml_elem *)0x0,leaf,(lyd_attr *)0x0,
                                     (lys_module *)0x0,1,0,0);
            if (plVar1 == (lys_type *)0x0) {
              return -1;
            }
            ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,&local_38,(ly_err_item **)0x0);
          }
          else {
            (leaf->value).binary = (char *)local_50;
            leaf->value_type = LY_TYPE_LEAFREF;
          }
        }
        else {
          plVar1 = lyp_parse_value(type_00,(char **)ret,(lyxml_elem *)0x0,leaf,(lyd_attr *)0x0,
                                   (lys_module *)0x0,found,0,0);
          if (plVar1 == (lys_type *)0x0) goto LAB_0011aca5;
        }
LAB_0011ae11:
        ly_ilo_restore((ly_ctx *)0x0,local_38,(ly_err_item *)0x0,0);
        if (value != (lys_node *)0x0) {
          lydict_remove(leaf->schema->module->ctx,(char *)value);
        }
LAB_0011ae55:
        if (resolved_type == (lys_type **)0x0) {
          return 0;
        }
        *resolved_type = type_00;
        return 0;
      }
      plVar4 = value;
      if (value == (lys_node *)0x0) {
        plVar4 = ret->schema;
      }
      iVar2 = check_instid_ext_dep(leaf->schema,(char *)plVar4);
      iVar3 = -1;
      if ((ignore_fail != 1) && (ignore_fail != 2 || iVar2 == 0)) {
        iVar3 = (int)(type_00->info).inst.req;
      }
      plVar4 = value;
      if (value == (lys_node *)0x0) {
        plVar4 = ret->schema;
      }
      iVar3 = resolve_instid((lyd_node *)leaf,(char *)plVar4,iVar3,&local_50);
      bVar6 = iVar3 != 0;
      if ((found != 0) && (iVar3 == 0)) {
        if ((local_50 == (lyd_node *)0x0) || (iVar2 != 0)) {
          (leaf->value).binary = (char *)value;
          leaf->value_type = LY_TYPE_INST;
          leaf->value_flags = leaf->value_flags | 1;
        }
        else {
          (leaf->value).binary = (char *)local_50;
          leaf->value_type = LY_TYPE_INST;
          if (value != (lys_node *)0x0) {
            lydict_remove(leaf->schema->module->ctx,leaf->value_str);
            leaf->value_str = (char *)value;
          }
        }
        ly_ilo_restore((ly_ctx *)0x0,local_38,(ly_err_item *)0x0,0);
        goto LAB_0011ae55;
      }
LAB_0011ac68:
      if (!bVar6) goto LAB_0011ae11;
LAB_0011aca5:
      if (found != 0) {
        lyd_free_value(leaf->value,leaf->value_type,leaf->value_flags,type_00,leaf->value_str,
                       (lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
        (leaf->value).binary = (char *)0x0;
      }
      type_00 = lyp_get_next_union_type(type,type_00,&local_3c);
    } while (type_00 != (lys_type *)0x0);
  }
  ly_ilo_restore((ly_ctx *)0x0,local_38,(ly_err_item *)0x0,0);
  if (value != (lys_node *)0x0) {
    if (leaf->value_type != LY_TYPE_UNION) {
      __assert_fail("leaf->value_type == LY_TYPE_UNION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x1fb6,
                    "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                   );
    }
    (leaf->value).binary = (char *)value;
  }
  if ((ignore_fail == 0) || (iVar2 = 0, (type->info).uni.has_ptr_type == 0)) {
    pcVar5 = "";
    if (leaf->value_str != (char *)0x0) {
      pcVar5 = leaf->value_str;
    }
    ly_vlog(ctx,LYE_INVAL,LY_VLOG_LYD,leaf,pcVar5,leaf->schema->name);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
resolve_union(struct lyd_node_leaf_list *leaf, struct lys_type *type, int store, int ignore_fail,
              struct lys_type **resolved_type)
{
    struct ly_ctx *ctx = leaf->schema->module->ctx;
    struct lys_type *t;
    struct lyd_node *ret;
    enum int_log_opts prev_ilo;
    int found, success = 0, ext_dep, req_inst;
    const char *json_val = NULL;

    assert(type->base == LY_TYPE_UNION);

    if ((leaf->value_type == LY_TYPE_UNION) || ((leaf->value_type == LY_TYPE_INST) && (leaf->value_flags & LY_VALUE_UNRES))) {
        /* either NULL or instid previously converted to JSON */
        json_val = lydict_insert(ctx, leaf->value.string, 0);
    }

    if (store) {
        lyd_free_value(leaf->value, leaf->value_type, leaf->value_flags, &((struct lys_node_leaf *)leaf->schema)->type,
                       leaf->value_str, NULL, NULL, NULL);
        memset(&leaf->value, 0, sizeof leaf->value);
    }

    /* turn logging off, we are going to try to validate the value with all the types in order */
    ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, 0);

    t = NULL;
    found = 0;
    while ((t = lyp_get_next_union_type(type, t, &found))) {
        found = 0;

        switch (t->base) {
        case LY_TYPE_LEAFREF:
            if ((ignore_fail == 1) || ((leaf->schema->flags & LYS_LEAFREF_DEP) && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.lref.req;
            }

            if (!resolve_leafref(leaf, t->info.lref.path, req_inst, &ret)) {
                if (store) {
                    if (ret && !(leaf->schema->flags & LYS_LEAFREF_DEP)) {
                        /* valid resolved */
                        leaf->value.leafref = ret;
                        leaf->value_type = LY_TYPE_LEAFREF;
                    } else {
                        /* valid unresolved */
                        ly_ilo_restore(NULL, prev_ilo, NULL, 0);
                        if (!lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, NULL, 1, 0, 0)) {
                            return -1;
                        }
                        ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
                    }
                }

                success = 1;
            }
            break;
        case LY_TYPE_INST:
            ext_dep = check_instid_ext_dep(leaf->schema, (json_val ? json_val : leaf->value_str));
            if ((ignore_fail == 1) || (ext_dep && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.inst.req;
            }

            if (!resolve_instid((struct lyd_node *)leaf, (json_val ? json_val : leaf->value_str), req_inst, &ret)) {
                if (store) {
                    if (ret && !ext_dep) {
                        /* valid resolved */
                        leaf->value.instance = ret;
                        leaf->value_type = LY_TYPE_INST;

                        if (json_val) {
                            lydict_remove(leaf->schema->module->ctx, leaf->value_str);
                            leaf->value_str = json_val;
                            json_val = NULL;
                        }
                    } else {
                        /* valid unresolved */
                        if (json_val) {
                            /* put the JSON val back */
                            leaf->value.string = json_val;
                            json_val = NULL;
                        } else {
                            leaf->value.instance = NULL;
                        }
                        leaf->value_type = LY_TYPE_INST;
                        leaf->value_flags |= LY_VALUE_UNRES;
                    }
                }

                success = 1;
            }
            break;
        default:
            if (lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, NULL, store, 0, 0)) {
                success = 1;
            }
            break;
        }

        if (success) {
            break;
        }

        /* erase possible present and invalid value data */
        if (store) {
            lyd_free_value(leaf->value, leaf->value_type, leaf->value_flags, t, leaf->value_str, NULL, NULL, NULL);
            memset(&leaf->value, 0, sizeof leaf->value);
        }
    }

    /* turn logging back on */
    ly_ilo_restore(NULL, prev_ilo, NULL, 0);

    if (json_val) {
        if (!success) {
            /* put the value back for now */
            assert(leaf->value_type == LY_TYPE_UNION);
            leaf->value.string = json_val;
        } else {
            /* value was ultimately useless, but we could not have known */
            lydict_remove(leaf->schema->module->ctx, json_val);
        }
    }

    if (success) {
        if (resolved_type) {
            *resolved_type = t;
        }
    } else if (!ignore_fail || !type->info.uni.has_ptr_type) {
        /* not found and it is required */
        LOGVAL(ctx, LYE_INVAL, LY_VLOG_LYD, leaf, leaf->value_str ? leaf->value_str : "", leaf->schema->name);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;

}